

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildNameCommand.cxx
# Opt level: O0

bool __thiscall
cmBuildNameCommand::InitialPass
          (cmBuildNameCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  RegularExpression *this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  char *pcVar5;
  ulong uVar6;
  string local_370;
  allocator local_349;
  undefined1 local_348 [8];
  string compiler;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [8];
  RegularExpression reg_1;
  string local_1d0 [8];
  string RegExp;
  string local_1a8;
  allocator local_181;
  undefined1 local_180 [8];
  string buildname;
  undefined1 local_158 [8];
  string cv;
  RegularExpression reg;
  char *cacheValue;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmBuildNameCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0036,
                     "The build_name command should not be called; see CMP0036.");
  if (bVar2) {
    this_local._7_1_ = 1;
  }
  else {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    if (sVar3 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_48,"called with incorrect number of arguments",&local_49);
      cmCommand::SetError(&this->super_cmCommand,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      this_local._7_1_ = 0;
    }
    else {
      pcVar1 = (this->super_cmCommand).Makefile;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,0);
      pcVar5 = cmMakefile::GetDefinition(pcVar1,pvVar4);
      if (pcVar5 == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_180,"WinNT",&local_181);
        std::allocator<char>::~allocator((allocator<char> *)&local_181);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1a8,"UNIX",(allocator *)(RegExp.field_2._M_local_buf + 0xf));
        pcVar5 = cmMakefile::GetDefinition(pcVar1,&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::allocator<char>::~allocator((allocator<char> *)(RegExp.field_2._M_local_buf + 0xf));
        if (pcVar5 != (char *)0x0) {
          std::__cxx11::string::operator=((string *)local_180,"");
          cmSystemTools::RunSingleCommand
                    ("uname -a",(string *)local_180,(string *)local_180,(int *)0x0,(char *)0x0,
                     OUTPUT_MERGE,0.0);
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_1d0,"([^ ]*) [^ ]* ([^ ]*) ",
                       (allocator *)((long)&reg_1.searchstring + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&reg_1.searchstring + 7));
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmsys::RegularExpression::RegularExpression((RegularExpression *)local_2a8,pcVar5);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            bVar2 = cmsys::RegularExpression::find((RegularExpression *)local_2a8,pcVar5);
            if (bVar2) {
              cmsys::RegularExpression::match_abi_cxx11_
                        (&local_308,(RegularExpression *)local_2a8,1);
              std::operator+(&local_2e8,&local_308,"-");
              cmsys::RegularExpression::match_abi_cxx11_
                        ((string *)((long)&compiler.field_2 + 8),(RegularExpression *)local_2a8,2);
              std::operator+(&local_2c8,&local_2e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&compiler.field_2 + 8));
              std::__cxx11::string::operator=((string *)local_180,(string *)&local_2c8);
              std::__cxx11::string::~string((string *)&local_2c8);
              std::__cxx11::string::~string((string *)(compiler.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)&local_2e8);
              std::__cxx11::string::~string((string *)&local_308);
            }
            cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_2a8);
            std::__cxx11::string::~string(local_1d0);
          }
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_348,"${CMAKE_CXX_COMPILER}",&local_349);
        std::allocator<char>::~allocator((allocator<char> *)&local_349);
        cmMakefile::ExpandVariablesInString((this->super_cmCommand).Makefile,(string *)local_348);
        std::__cxx11::string::operator+=((string *)local_180,"-");
        cmsys::SystemTools::GetFilenameName(&local_370,(string *)local_348);
        std::__cxx11::string::operator+=((string *)local_180,(string *)&local_370);
        std::__cxx11::string::~string((string *)&local_370);
        cmsys::SystemTools::ReplaceString((string *)local_180,"/","_");
        cmsys::SystemTools::ReplaceString((string *)local_180,"(","_");
        cmsys::SystemTools::ReplaceString((string *)local_180,")","_");
        pcVar1 = (this->super_cmCommand).Makefile;
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,0);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddCacheDefinition(pcVar1,pvVar4,pcVar5,"Name of build.",STRING,false);
        this_local._7_1_ = 1;
        std::__cxx11::string::~string((string *)local_348);
        std::__cxx11::string::~string((string *)local_180);
      }
      else {
        this_00 = (RegularExpression *)((long)&cv.field_2 + 8);
        cmsys::RegularExpression::RegularExpression(this_00,"[()/]");
        bVar2 = cmsys::RegularExpression::find(this_00,pcVar5);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_158,pcVar5,(allocator *)(buildname.field_2._M_local_buf + 0xf))
          ;
          std::allocator<char>::~allocator
                    ((allocator<char> *)(buildname.field_2._M_local_buf + 0xf));
          cmsys::SystemTools::ReplaceString((string *)local_158,"/","_");
          cmsys::SystemTools::ReplaceString((string *)local_158,"(","_");
          cmsys::SystemTools::ReplaceString((string *)local_158,")","_");
          pcVar1 = (this->super_cmCommand).Makefile;
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local,0);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddCacheDefinition(pcVar1,pvVar4,pcVar5,"Name of build.",STRING,false);
          std::__cxx11::string::~string((string *)local_158);
        }
        this_local._7_1_ = 1;
        cmsys::RegularExpression::~RegularExpression((RegularExpression *)((long)&cv.field_2 + 8));
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmBuildNameCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0036,
      "The build_name command should not be called; see CMP0036."))
    { return true; }
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  const char* cacheValue = this->Makefile->GetDefinition(args[0]);
  if(cacheValue)
    {
    // do we need to correct the value?
    cmsys::RegularExpression reg("[()/]");
    if (reg.find(cacheValue))
      {
      std::string cv = cacheValue;
      cmSystemTools::ReplaceString(cv,"/", "_");
      cmSystemTools::ReplaceString(cv,"(", "_");
      cmSystemTools::ReplaceString(cv,")", "_");
      this->Makefile->AddCacheDefinition(args[0],
                                     cv.c_str(),
                                     "Name of build.",
                                     cmState::STRING);
      }
    return true;
    }


  std::string buildname = "WinNT";
  if(this->Makefile->GetDefinition("UNIX"))
    {
    buildname = "";
    cmSystemTools::RunSingleCommand("uname -a", &buildname, &buildname);
    if(!buildname.empty())
      {
      std::string RegExp = "([^ ]*) [^ ]* ([^ ]*) ";
      cmsys::RegularExpression reg( RegExp.c_str() );
      if(reg.find(buildname.c_str()))
        {
        buildname = reg.match(1) + "-" + reg.match(2);
        }
      }
    }
  std::string compiler = "${CMAKE_CXX_COMPILER}";
  this->Makefile->ExpandVariablesInString ( compiler );
  buildname += "-";
  buildname += cmSystemTools::GetFilenameName(compiler);
  cmSystemTools::ReplaceString(buildname,
                               "/", "_");
  cmSystemTools::ReplaceString(buildname,
                               "(", "_");
  cmSystemTools::ReplaceString(buildname,
                               ")", "_");

  this->Makefile->AddCacheDefinition(args[0],
                                 buildname.c_str(),
                                 "Name of build.",
                                 cmState::STRING);
  return true;
}